

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O0

void __thiscall
UnifiedRegex::CharSet<char16_t>::CloneFrom
          (CharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  CharSetNode *pCVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  size_t local_40;
  uint local_24;
  uint i;
  CharSet<char16_t> *other_local;
  ArenaAllocator *allocator_local;
  CharSet<char16_t> *this_local;
  
  Clear(this,allocator);
  bVar3 = IsCompact(this);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x3a6,"(IsCompact())","IsCompact()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar3 = IsCompact(other);
  if (bVar3) {
    uVar4 = GetCompactLength(other);
    SetCompactLength(this,(ulong)uVar4);
    for (local_24 = 0; uVar4 = GetCompactLength(other), local_24 < uVar4; local_24 = local_24 + 1) {
      uVar4 = GetCompactCharU(other,local_24);
      ReplaceCompactCharU(this,local_24,uVar4);
    }
  }
  else {
    if ((other->rep).compact.countPlusOne == 0) {
      local_40 = 0;
    }
    else {
      pCVar1 = (other->rep).full.root;
      iVar5 = (*pCVar1->_vptr_CharSetNode[1])(pCVar1,allocator);
      local_40 = CONCAT44(extraout_var,iVar5);
    }
    (this->rep).compact.countPlusOne = local_40;
    CharBitvec::CloneFrom(&(this->rep).full.direct,&(other->rep).full.direct);
  }
  return;
}

Assistant:

void CharSet<char16>::CloneFrom(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        Clear(allocator);
        Assert(IsCompact());
        if (other.IsCompact())
        {
            this->SetCompactLength(other.GetCompactLength());
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                this->ReplaceCompactCharU(i, other.GetCompactCharU(i));
            }
        }
        else
        {
            rep.full.root = other.rep.full.root == nullptr ? nullptr : other.rep.full.root->Clone(allocator);
            rep.full.direct.CloneFrom(other.rep.full.direct);
        }
    }